

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcombobox_p.cpp
# Opt level: O1

void QComboBoxPrivateContainer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QComboBoxPrivateContainer_to_subr *candidate;
  undefined4 uVar2;
  void **ppvVar3;
  int iVar4;
  long in_FS_OFFSET;
  void *local_28;
  void *pvStack_20;
  long local_18;
  
  ppvVar3 = &local_28;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((code *)*plVar1 == itemSelected) && (uVar2 = 0, plVar1[1] == 0)) ||
       (((code *)*plVar1 == resetButton && (uVar2 = 1, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar2;
    }
    goto LAB_003e4afd;
  }
  if (_c != InvokeMetaMethod) goto LAB_003e4afd;
  switch(_id) {
  case 0:
    pvStack_20 = _a[1];
    local_28 = (void *)0x0;
    iVar4 = 0;
    goto LAB_003e4ab6;
  case 1:
    iVar4 = 1;
    ppvVar3 = (void **)0x0;
LAB_003e4ab6:
    QMetaObject::activate(_o,&staticMetaObject,iVar4,ppvVar3);
    break;
  case 2:
    scrollItemView((QComboBoxPrivateContainer *)_o,*_a[1]);
    break;
  case 3:
    hideScrollers((QComboBoxPrivateContainer *)_o);
    break;
  case 4:
    updateScrollers((QComboBoxPrivateContainer *)_o);
    break;
  case 5:
    viewDestroyed((QComboBoxPrivateContainer *)_o);
  }
LAB_003e4afd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QComboBoxPrivateContainer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemSelected((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 1: _t->resetButton(); break;
        case 2: _t->scrollItemView((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->hideScrollers(); break;
        case 4: _t->updateScrollers(); break;
        case 5: _t->viewDestroyed(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QComboBoxPrivateContainer::*)(const QModelIndex & )>(_a, &QComboBoxPrivateContainer::itemSelected, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBoxPrivateContainer::*)()>(_a, &QComboBoxPrivateContainer::resetButton, 1))
            return;
    }
}